

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void __thiscall
prometheus::TextSerializer::Serialize
          (TextSerializer *this,ostream *out,
          vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics)

{
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *this_00;
  bool bVar1;
  locale local_70 [8];
  reference local_68;
  MetricFamily *family;
  const_iterator __end1;
  const_iterator __begin1;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *__range1;
  streamsize local_30;
  streamsize saved_precision;
  locale saved_locale;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics_local;
  ostream *out_local;
  TextSerializer *this_local;
  
  _saved_locale = metrics;
  std::ios_base::getloc((ios_base *)&saved_precision);
  local_30 = std::ios_base::precision((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  std::locale::classic();
  std::ios::imbue((locale *)&__range1);
  std::locale::~locale((locale *)&__range1);
  std::ios_base::precision((ios_base *)(out + *(long *)(*(long *)out + -0x18)),0x10);
  this_00 = _saved_locale;
  __end1 = std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::begin
                     (_saved_locale);
  family = (MetricFamily *)
           std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::end
                     (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
                                *)&family);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<const_prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
               ::operator*(&__end1);
    anon_unknown_5::SerializeFamily(out,local_68);
    __gnu_cxx::
    __normal_iterator<const_prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
    ::operator++(&__end1);
  }
  std::ios::imbue(local_70);
  std::locale::~locale(local_70);
  std::ios_base::precision((ios_base *)(out + *(long *)(*(long *)out + -0x18)),local_30);
  std::locale::~locale((locale *)&saved_precision);
  return;
}

Assistant:

void TextSerializer::Serialize(std::ostream& out,
                               const std::vector<MetricFamily>& metrics) const {
  auto saved_locale = out.getloc();
  auto saved_precision = out.precision();

  out.imbue(std::locale::classic());
  out.precision(std::numeric_limits<double>::max_digits10 - 1);

  for (auto& family : metrics) {
    SerializeFamily(out, family);
  }

  out.imbue(saved_locale);
  out.precision(saved_precision);
}